

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_> *
__thiscall
grammar::cyclic_path
          (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
           *__return_storage_ptr__,grammar *this)

{
  mapped_type *this_00;
  const_reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  pointer ppVar4;
  long lVar5;
  pointer ppVar6;
  ulong __n;
  _Vector_base<std::pair<strong_t<int,_grammar::token_tag>,_unsigned_long>,_std::allocator<std::pair<strong_t<int,_grammar::token_tag>,_unsigned_long>_>_>
  local_a8;
  size_t start_symbol;
  strong_t<int,_grammar::token_tag> local_84;
  vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
  *local_80;
  _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_78;
  grammar *local_40;
  map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
  *local_38;
  
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  start_symbol = 1;
  local_38 = &this->rules;
  local_80 = (vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
              *)__return_storage_ptr__;
  local_40 = this;
  do {
    if ((local_40->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count <= start_symbol) {
      *(undefined8 *)__return_storage_ptr__ = 0;
      *(pointer *)((long)__return_storage_ptr__ + 8) = (pointer)0x0;
      *(pointer *)((long)__return_storage_ptr__ + 0x10) = (pointer)0x0;
LAB_001048ff:
      std::
      _Vector_base<std::pair<strong_t<int,_grammar::token_tag>,_unsigned_long>,_std::allocator<std::pair<strong_t<int,_grammar::token_tag>,_unsigned_long>_>_>
      ::~_Vector_base(&local_a8);
      return (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              *)(vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                 *)__return_storage_ptr__;
    }
    if (local_a8._M_impl.super__Vector_impl_data._M_start ==
        local_a8._M_impl.super__Vector_impl_data._M_finish) {
      local_78._M_impl._0_4_ = 0xffffffff;
      std::
      vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
      ::emplace_back<unsigned_long&,int>
                ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                  *)&local_a8,&start_symbol,(int *)&local_78);
      start_symbol = start_symbol + 1;
    }
    ppVar6 = local_a8._M_impl.super__Vector_impl_data._M_finish + -1;
    this_00 = std::
              map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
              ::at(local_38,&ppVar6->first);
    __n = local_a8._M_impl.super__Vector_impl_data._M_finish[-1].second + 1;
    lVar5 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8._M_impl.super__Vector_impl_data._M_start;
    while (__return_storage_ptr__ =
                (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 *)local_80, ppVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish,
          (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_a8._M_impl.super__Vector_impl_data._M_start == lVar5) {
      if ((((__n < (ulong)((long)(this_00->
                                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 2)) &&
           (pvVar1 = std::
                     vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                     ::at(this_00,__n), 0 < pvVar1->internal_rep)) &&
          (pvVar1 = std::
                    vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                    ::at(this_00,__n), pvVar1->internal_rep != (ppVar6->first).internal_rep)) &&
         (((__n == 0 ||
           (pvVar1 = std::
                     vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                     ::at(this_00,__n - 1), pvVar1->internal_rep == 0)) &&
          ((__n == ((long)(this_00->
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2) - 1U ||
           (pvVar1 = std::
                     vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                     ::at(this_00,__n + 1), pvVar1->internal_rep == 0)))))) {
        local_a8._M_impl.super__Vector_impl_data._M_finish[-1].second = __n;
        pvVar1 = std::
                 vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 ::at(this_00,__n);
        local_78._M_impl._0_4_ = 0xffffffff;
        std::
        vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
        ::emplace_back<strong_t<int,grammar::token_tag>const&,int>
                  ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                    *)&local_a8,pvVar1,(int *)&local_78);
      }
      else {
        for (; uVar2 = (long)(this_00->
                             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->
                             super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2, __n < uVar2;
            __n = __n + 1) {
          pvVar1 = std::
                   vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                   ::at(this_00,__n);
          if (pvVar1->internal_rep == 0) {
            uVar2 = (long)(this_00->
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2;
            break;
          }
        }
        __n = __n + 1;
        if (uVar2 <= __n) {
          local_a8._M_impl.super__Vector_impl_data._M_finish =
               local_a8._M_impl.super__Vector_impl_data._M_finish + -1;
        }
      }
    }
    local_78._M_impl._0_8_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppVar6 = local_a8._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar4;
        ppVar6 = ppVar6 + 1) {
      sVar3 = std::
              set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              ::count((set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                       *)&local_78,&ppVar6->first);
      if (sVar3 != 0) {
        *(undefined8 *)__return_storage_ptr__ = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0;
        *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0;
        std::
        vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
        ::reserve(__return_storage_ptr__,
                  (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 4);
        ppVar6 = local_a8._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar4 = local_a8._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar6;
            ppVar4 = ppVar4 + 1) {
          local_84.internal_rep = (ppVar4->first).internal_rep;
          std::
          vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
          ::emplace_back<strong_t<int,grammar::token_tag>>
                    ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                      *)__return_storage_ptr__,&local_84);
        }
        std::
        _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
        ::~_Rb_tree(&local_78);
        goto LAB_001048ff;
      }
      std::
      _Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
      ::_M_insert_unique<strong_t<int,grammar::token_tag>const&>
                ((_Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
                  *)&local_78,&ppVar6->first);
    }
    std::
    _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
    ::~_Rb_tree(&local_78);
  } while( true );
}

Assistant:

std::vector<token_t> grammar::cyclic_path() const {
    // Path so far
    std::vector<std::pair<token_t /*token*/, size_t /*option*/>> path{};

    size_t start_symbol = 1;

    while (start_symbol < nonterminal_count()) {
        // Pick start point
        if (path.empty()) {
            path.emplace_back(start_symbol, -1);
            start_symbol++;
        }

        // Read the options of the path and which option to chose
        const auto & current_symbol = path.back().first;
        const auto & options        = rules.at(current_symbol);
        auto         rule_used      = path.back().second + 1;

        const auto old_path_length = path.size();
        while (path.size() == old_path_length) {
            if (rule_used < options.size()
                and options.at(rule_used) > 0
                // the rule used is pointing at a nonterminal
                and options.at(rule_used) != current_symbol
                // the rule is not generating the same symbol
                and (rule_used == 0 /*there is nothing to the left of us*/
                     or options.at(rule_used - 1) == rule_sep
                     /*the left is a rule separator*/)
                and (rule_used == options.size() - 1
                     or options.at(rule_used + 1) == rule_sep)) {
                // found a valid rule to use
                path.back().second = rule_used;
                path.emplace_back(options.at(rule_used), -1);
            } else {
                // move to the next valid rule
                while (rule_used < options.size()
                       and options.at(rule_used) != rule_sep)
                    rule_used++;
                rule_used++;
                if (rule_used >= options.size()) {
                    // used all options -> go back
                    path.pop_back();
                }
            }
        }

        // Check the path for repeats
        std::set<token_t> seen_nonterminals{};
        for (const auto & entry : path)
            if (seen_nonterminals.count(entry.first) != 0) {
                std::vector<token_t> to_ret;
                to_ret.reserve(path.size());
                std::transform(path.begin(), path.end(),
                               std::back_inserter(to_ret),
                               [](const auto & entry) { return entry.first; });
                return to_ret;
            } else
                seen_nonterminals.insert(entry.first);
    }

    return {};
}